

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_ObjFaninNumberNew(Vec_Ptr_t *vFanins,Abc_Obj_t *pFanin)

{
  long lVar1;
  
  if (0 < (long)vFanins->nSize) {
    lVar1 = 0;
    do {
      if ((Abc_Obj_t *)vFanins->pArray[lVar1] == pFanin) {
        return (int)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (vFanins->nSize != lVar1);
  }
  return -1;
}

Assistant:

int Abc_ObjFaninNumberNew( Vec_Ptr_t * vFanins, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        if ( pObj == pFanin )
            return i;
    return -1;
}